

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32.cc
# Opt level: O3

uint32_t crc32_1(void *data,size_t len,uint32_t prev_value)

{
  uint uVar1;
  size_t sVar2;
  uint8_t *cur;
  
  if (len != 0) {
    uVar1 = ~prev_value;
    sVar2 = 0;
    do {
      uVar1 = uVar1 >> 8 ^ crc_lookup[0][(uint)*(byte *)((long)data + sVar2) ^ uVar1 & 0xff];
      sVar2 = sVar2 + 1;
    } while (len != sVar2);
    prev_value = ~uVar1;
  }
  return prev_value;
}

Assistant:

uint32_t crc32_1(const void* data, size_t len, uint32_t prev_value)
{
    uint32_t crc = ~prev_value;
    const uint8_t* cur = (const uint8_t*) data;

    while (len-- > 0)
        crc = (crc >> 8) ^ crc_lookup[0][(crc & 0xFF) ^ *cur++];

    return ~crc;
}